

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool __thiscall
MultiSigningProvider::GetPubKey(MultiSigningProvider *this,CKeyID *keyid,CPubKey *pubkey)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  undefined8 *puVar5;
  unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *provider;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = *(undefined8 **)&this->field_0x10;
  puVar3 = *(undefined8 **)&this->m_providers;
  do {
    puVar5 = puVar3;
    if (puVar5 == puVar2) break;
    cVar4 = (**(code **)(*(long *)*puVar5 + 0x20))((long *)*puVar5,keyid,pubkey);
    puVar3 = puVar5 + 1;
  } while (cVar4 == '\0');
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return puVar5 != puVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool MultiSigningProvider::GetPubKey(const CKeyID& keyid, CPubKey& pubkey) const
{
    for (const auto& provider: m_providers) {
        if (provider->GetPubKey(keyid, pubkey)) return true;
    }
    return false;
}